

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O3

string * __thiscall pstack::Dwarf::DIE::name_abi_cxx11_(string *__return_storage_ptr__,DIE *this)

{
  undefined1 local_48 [8];
  Attribute attr;
  
  attribute((Attribute *)local_48,this,DW_AT_name,false);
  if (attr.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    Attribute::operator_cast_to_string(__return_storage_ptr__,(Attribute *)local_48);
  }
  ~DIE((DIE *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string
DIE::name() const
{
    auto attr = attribute(DW_AT_name);
    return attr.valid() ? std::string(attr) : "";
}